

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_mul(EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *scalars [1];
  EC_POINT *points [1];
  bool local_41;
  BIGNUM *local_40;
  EC_POINT *local_38;
  BN_CTX *local_30;
  BIGNUM *local_28;
  EC_POINT *local_20;
  BIGNUM *local_18;
  EC_POINT *local_10;
  EC_GROUP *local_8;
  
  local_41 = q != (EC_POINT *)0x0 && m != (BIGNUM *)0x0;
  local_40 = m;
  local_38 = q;
  local_30 = ctx;
  local_28 = m;
  local_20 = q;
  local_18 = n;
  local_10 = r;
  local_8 = group;
  iVar1 = EC_POINTs_mul(group,r,n,(long)(int)(uint)local_41,&local_38,&local_40,ctx);
  return iVar1;
}

Assistant:

int EC_POINT_mul(const EC_GROUP *group, EC_POINT *r, const BIGNUM *g_scalar,
                 const EC_POINT *point, const BIGNUM *p_scalar, BN_CTX *ctx)
{
    /* just a convenient interface to EC_POINTs_mul() */

    const EC_POINT *points[1];
    const BIGNUM *scalars[1];

    points[0] = point;
    scalars[0] = p_scalar;

    return EC_POINTs_mul(group, r, g_scalar,
                         (point != NULL
                          && p_scalar != NULL), points, scalars, ctx);
}